

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

Node * __thiscall Fl_Preferences::Node::childNode(Node *this,int ix)

{
  int iVar1;
  Node *local_28;
  Node *nd;
  int n;
  int ix_local;
  Node *this_local;
  
  createIndex(this);
  if (((byte)this->field_0x30 >> 2 & 1) == 0) {
    iVar1 = nChildren(this);
    nd._4_4_ = iVar1 - ix;
    for (local_28 = this->child_;
        ((nd._4_4_ = nd._4_4_ + -1, local_28 != (Node *)0x0 && (nd._4_4_ != 0)) &&
        (local_28 != (Node *)0x0)); local_28 = local_28->next_) {
    }
    this_local = local_28;
  }
  else {
    this_local = this->index_[ix];
  }
  return this_local;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::childNode( int ix ) {
  createIndex();
  if (indexed_) {
    // usually faster access in correct order, but needing more memory
    return index_[ix];
  } else {
    // slow access and reverse order
    int n = nChildren();
    ix = n - ix -1;
    Node *nd;
    for ( nd = child_; nd; nd = nd->next_ ) {
      if ( !ix-- ) break;
      if ( !nd ) break;
    }
    return nd;
  }
}